

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexConcaveCollisionAlgorithm.cpp
# Opt level: O0

void __thiscall
btConvexConcaveCollisionAlgorithm::calculateTimeOfImpact::LocalTriangleSphereCastCallback::
processTriangle(LocalTriangleSphereCastCallback *this,btVector3 *triangle,int partId,
               int triangleIndex)

{
  bool bVar1;
  btTransform *in_RDI;
  btSubsimplexConvexCast convexCaster;
  btVoronoiSimplexSolver simplexSolver;
  btTriangleShape triShape;
  btSphereShape pointShape;
  CastResult castResult;
  btTransform ident;
  btVoronoiSimplexSolver *in_stack_fffffffffffffc68;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  btConvexShape *convexA;
  btVector3 *in_stack_fffffffffffffc98;
  btVector3 *in_stack_fffffffffffffca0;
  btVector3 *in_stack_fffffffffffffca8;
  btVoronoiSimplexSolver *in_stack_fffffffffffffcb0;
  CastResult local_118;
  CastResult *in_stack_ffffffffffffffb0;
  btTransform *in_stack_ffffffffffffffb8;
  btTransform *in_stack_ffffffffffffffc0;
  btTransform *in_stack_ffffffffffffffc8;
  btTransform *in_stack_ffffffffffffffd0;
  btSubsimplexConvexCast *in_stack_ffffffffffffffd8;
  
  convexA = (btConvexShape *)&stack0xffffffffffffffa8;
  btTransform::btTransform
            ((btTransform *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
  btTransform::setIdentity(in_RDI);
  btConvexCast::CastResult::CastResult
            ((CastResult *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
  local_118.m_fraction = in_RDI[3].m_basis.m_el[0].m_floats[3];
  btSphereShape::btSphereShape((btSphereShape *)in_RDI,(btScalar)((ulong)convexA >> 0x20));
  btTriangleShape::btTriangleShape
            ((btTriangleShape *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  btVoronoiSimplexSolver::btVoronoiSimplexSolver(in_stack_fffffffffffffcb0);
  btSubsimplexConvexCast::btSubsimplexConvexCast
            ((btSubsimplexConvexCast *)in_RDI,convexA,
             (btConvexShape *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
             in_stack_fffffffffffffc68);
  bVar1 = btSubsimplexConvexCast::calcTimeOfImpact
                    (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                     in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if ((bVar1) && (local_118.m_fraction < in_RDI[3].m_basis.m_el[0].m_floats[3])) {
    in_RDI[3].m_basis.m_el[0].m_floats[3] = local_118.m_fraction;
  }
  btSubsimplexConvexCast::~btSubsimplexConvexCast((btSubsimplexConvexCast *)0x1936ca);
  btTriangleShape::~btTriangleShape((btTriangleShape *)0x1936d7);
  btSphereShape::~btSphereShape((btSphereShape *)0x1936e4);
  btConvexCast::CastResult::~CastResult(&local_118);
  return;
}

Assistant:

virtual void processTriangle(btVector3* triangle, int partId, int triangleIndex)
		{
			(void)partId;
			(void)triangleIndex;
			//do a swept sphere for now
			btTransform ident;
			ident.setIdentity();
			btConvexCast::CastResult castResult;
			castResult.m_fraction = m_hitFraction;
			btSphereShape	pointShape(m_ccdSphereRadius);
			btTriangleShape	triShape(triangle[0],triangle[1],triangle[2]);
			btVoronoiSimplexSolver	simplexSolver;
			btSubsimplexConvexCast convexCaster(&pointShape,&triShape,&simplexSolver);
			//GjkConvexCast	convexCaster(&pointShape,convexShape,&simplexSolver);
			//ContinuousConvexCollision convexCaster(&pointShape,convexShape,&simplexSolver,0);
			//local space?

			if (convexCaster.calcTimeOfImpact(m_ccdSphereFromTrans,m_ccdSphereToTrans,
				ident,ident,castResult))
			{
				if (m_hitFraction > castResult.m_fraction)
					m_hitFraction = castResult.m_fraction;
			}

		}